

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  byte bVar2;
  ushort uVar3;
  CTState *cts;
  CTState *cts_00;
  lua_State *plVar4;
  BCIns *pBVar5;
  TValue *pTVar6;
  BCIns *pBVar7;
  TraceError TVar8;
  TRef TVar9;
  CTypeID id;
  uint uVar10;
  CTInfo CVar11;
  TRef TVar12;
  IRType IVar13;
  GCcdata *cd;
  cTValue *pcVar14;
  uint64_t uVar15;
  IRRef1 IVar16;
  MMS mm;
  uint uVar17;
  TRef *pTVar18;
  CType *pCVar19;
  ulong uVar20;
  IRRef1 IVar21;
  CType *pCVar22;
  TValue *pTVar23;
  MMS MVar24;
  ulong uVar25;
  ulong uVar26;
  CType *pCVar27;
  bool bVar28;
  IRRef1 local_d0;
  cTValue local_c0;
  TRef local_b8;
  TRef local_b4 [33];
  
  cts = *(CTState **)&J[-1].penalty[0x3c].val;
  cd = argv2cdata(J,*J->base,rd->argv);
  uVar3 = cd->ctypeid;
  id = (CTypeID)uVar3;
  if (id == 0x16) {
    id = crec_constructor(J,cd,*J->base);
    mm = MM_new;
LAB_0015742a:
    uVar10 = cts->tab[id].info;
    uVar17 = uVar10 & 0xffff;
    if ((uVar10 & 0xf0000000) != 0x20000000) {
      uVar17 = id;
    }
    pcVar14 = lj_ctype_meta(cts,uVar17,mm);
    if (pcVar14 == (cTValue *)0x0) {
      if (uVar3 == 0x16) {
        crec_alloc(J,rd,id);
        return;
      }
    }
    else if ((pcVar14->field_4).it >> 0xf == 0x1fff7) {
      crec_tailcall(J,rd,pcVar14);
      return;
    }
    TVar8 = LJ_TRERR_BADTYPE;
LAB_001579bf:
    lj_trace_err(J,TVar8);
  }
  cts_00 = *(CTState **)&J[-1].penalty[0x3c].val;
  pCVar22 = cts_00->tab;
  CVar11 = pCVar22[uVar3].info;
  pCVar27 = pCVar22 + uVar3;
  mm = MM_call;
  MVar24 = mm;
  if ((CVar11 & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar27->size;
    uVar10 = CVar11 & 0xffff;
    CVar11 = pCVar22[uVar10].info;
    pCVar27 = pCVar22 + uVar10;
    MVar24 = (uint)(*pCVar1 == 8) * 4 + MM_FAST;
  }
  if ((CVar11 & 0xf0000000) != 0x60000000) goto LAB_0015742a;
  TVar12 = *J->base;
  (J->fold).ins.field_0.ot = (short)MVar24 + 0x4500;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
  (J->fold).ins.field_0.op2 = 0x17;
  TVar12 = lj_opt_fold(J);
  local_d0 = (IRRef1)TVar12;
  pCVar22 = cts_00->tab + (ushort)pCVar27->info;
  IVar13 = crec_ct2irt(cts_00,pCVar22);
  if (MVar24 == MM_call) {
    uVar15 = cd[1].nextgc.gcptr64;
  }
  else {
    uVar15 = (uint64_t)(uint)cd[1].nextgc.gcptr64;
  }
  local_c0.u64 = uVar15 >> 2;
  pcVar14 = lj_tab_get(J->L,cts_00->miscmap,&local_c0);
  if ((pcVar14->field_4).it >> 0xf == 0x1fffd) {
    TVar8 = LJ_TRERR_BLACKL;
LAB_001579de:
    lj_trace_err(J,TVar8);
  }
  uVar10 = pCVar22->info >> 0x1c;
  if (uVar10 == 4) {
    rd->nres = 0;
    IVar13 = IRT_NIL;
  }
  else if (((uVar10 != 2 && 0xfffffff < pCVar22->info) && (uVar10 != 5)) || (IVar13 == IRT_CDATA)) {
    TVar8 = LJ_TRERR_NYICALL;
    goto LAB_001579de;
  }
  if ((pCVar27->info & 0x800000) != 0) {
    TVar12 = lj_ir_kint(J,(int32_t)(((long)pCVar27 - (long)cts_00->tab) / 0x18));
    (J->fold).ins.field_0.ot = 0x6400;
    (J->fold).ins.field_0.op1 = local_d0;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    TVar12 = lj_opt_fold(J);
    local_d0 = (IRRef1)TVar12;
  }
  uVar3 = (ushort)IVar13;
  local_b8 = 0x7fff;
  pTVar18 = J->base;
  pTVar23 = rd->argv;
  uVar25 = 0;
  uVar26 = (ulong)pCVar27->sib;
  while (pTVar18[1] != 0) {
    if (uVar25 == 0x20) {
LAB_001579bd:
      TVar8 = LJ_TRERR_NYICALL;
      goto LAB_001579bf;
    }
    pTVar23 = pTVar23 + 1;
    if ((int)uVar26 == 0) {
      if ((pCVar27->info & 0x800000) == 0) goto LAB_001579bd;
      uVar10 = lj_ccall_ctid_vararg(cts_00,pTVar23);
      pCVar19 = cts_00->tab;
      uVar20 = 0;
    }
    else {
      pCVar19 = cts_00->tab;
      uVar20 = (ulong)pCVar19[uVar26].sib;
      uVar10 = (uint)(ushort)pCVar19[uVar26].info;
    }
    pTVar18 = pTVar18 + 1;
    if (((0xfffffff < pCVar19[uVar10].info) && (uVar17 = pCVar19[uVar10].info >> 0x1c, uVar17 != 2))
       && (uVar17 != 5)) goto LAB_001579bd;
    pCVar19 = pCVar19 + uVar10;
    TVar12 = crec_ct_tv(J,pCVar19,0,*pTVar18,pTVar23);
    uVar10 = pCVar19->info;
    if (((uVar10 & 0xf4000000) == 0) && (pCVar19->size < 4)) {
      bVar28 = pCVar19->size != 1;
      (J->fold).ins.field_0.ot = 0x5b13;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
      IVar16 = bVar28 + 0x270 + (ushort)bVar28;
      if ((uVar10 >> 0x17 & 1) == 0) {
        IVar16 = bVar28 + 0xa6f + (ushort)bVar28;
      }
      (J->fold).ins.field_0.op2 = IVar16;
      TVar12 = lj_opt_fold(J);
    }
    local_b4[uVar25 - 1] = TVar12;
    uVar25 = uVar25 + 1;
    uVar26 = uVar20;
  }
  TVar12 = local_b8;
  for (uVar26 = 1; uVar26 < (uVar25 & 0xffffffff); uVar26 = uVar26 + 1) {
    TVar9 = local_b4[uVar26 - 1];
    (J->fold).ins.field_0.ot = 0x6400;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar12 = lj_opt_fold(J);
  }
  (J->fold).ins.field_0.ot = uVar3 | 0x6300;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
  (J->fold).ins.field_0.op2 = local_d0;
  TVar12 = lj_opt_fold(J);
  IVar16 = (IRRef1)TVar12;
  if ((pCVar22->info & 0xf8000000) == 0x8000000) {
    plVar4 = J->L;
    pTVar23 = plVar4->base;
    pBVar5 = (BCIns *)pTVar23[-1].u64;
    if ((((ulong)pBVar5 & 3) != 0) || (TVar12 = 0x7fff, *(char *)((long)pBVar5 - 1) != '\x01')) {
      if ((((ulong)pBVar5 & 3) != 0) || (J->framedepth < 1)) {
        lj_trace_err(J,LJ_TRERR_NYICALL);
      }
      pTVar6 = plVar4->top;
      pBVar7 = J->pc;
      pTVar18 = J->base;
      TVar12 = pTVar18[-2];
      J->pc = pBVar5;
      bVar2 = *(byte *)((long)pBVar5 - 3);
      plVar4->top = pTVar23;
      plVar4->base = (TValue *)((long)pTVar23 - (ulong)((uint)bVar2 * 8 + 0x10));
      pTVar18[-2] = 0x1007ffe;
      uVar26 = (ulong)((uint)bVar2 * 4 + 8);
      J->base = (TRef *)((long)pTVar18 - uVar26);
      J->baseslot = J->baseslot - (bVar2 + 2);
      J->maxslot = bVar2 + 1;
      J->framedepth = J->framedepth + -1;
      lj_snap_add(J);
      plVar4->base = pTVar23;
      plVar4->top = pTVar6;
      J->framedepth = J->framedepth + 1;
      J->maxslot = 1;
      pTVar18 = J->base;
      J->base = (TRef *)((long)pTVar18 + uVar26);
      J->baseslot = J->baseslot + bVar2 + 2;
      *(TRef *)((long)pTVar18 + (uVar26 - 8)) = TVar12;
      J->pc = pBVar7;
      TVar12 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x990;
      (J->fold).ins.field_0.op1 = IVar16;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
      J->postproc = LJ_POST_FIXGUARDSNAP;
      TVar12 = 0x2007ffd;
    }
    goto LAB_0015791b;
  }
  if (((IVar13 < IRT_SOFTFP) && ((0x600220U >> (IVar13 & IRT_TYPE) & 1) != 0)) ||
     ((pCVar22->info & 0xf0000000) == 0x50000000)) {
    TVar12 = lj_ir_kint(J,(uint)(ushort)pCVar27->info);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
    (J->fold).ins.field_0.op2 = IVar16;
  }
  else {
    switch(IVar13) {
    case IRT_FLOAT:
    case IRT_U32:
      IVar21 = uVar3 | 0x1c0;
      (J->fold).ins.field_0.ot = 0x5b0e;
      goto LAB_0015798b;
    default:
      if ((IVar13 & ~IRT_TRUE) != IRT_U8) goto LAB_0015791b;
      IVar21 = uVar3 | 0x260;
      break;
    case IRT_I8:
    case IRT_I16:
      IVar21 = uVar3 | 0xa60;
    }
    (J->fold).ins.field_0.ot = 0x5b13;
LAB_0015798b:
    (J->fold).ins.field_0.op1 = IVar16;
    (J->fold).ins.field_0.op2 = IVar21;
  }
  TVar12 = lj_opt_fold(J);
LAB_0015791b:
  *J->base = TVar12;
  J->needsnap = '\x01';
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}